

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndFunctionBody
          (BinaryReaderInterp *this,Index index)

{
  bool bVar1;
  Location local_50;
  Enum local_2c;
  Enum local_28;
  u32 local_24;
  u32 local_20;
  Index keep_count;
  Index drop_count;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  keep_count = index;
  _drop_count = this;
  FixupTopLabel(this);
  local_28 = (Enum)GetReturnDropKeepCount(this,&local_20,&local_24);
  bVar1 = Failed((Result)local_28);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation(&local_50,this);
    local_2c = (Enum)SharedValidator::EndFunctionBody(&this->validator_,&local_50);
    bVar1 = Failed((Result)local_2c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::EmitDropKeep(this->istream_,local_20,local_24);
      Istream::Emit(this->istream_,Return);
      PopLabel(this);
      this->func_ = (FuncDesc *)0x0;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::EndFunctionBody(Index index) {
  FixupTopLabel();
  Index drop_count, keep_count;
  CHECK_RESULT(GetReturnDropKeepCount(&drop_count, &keep_count));
  CHECK_RESULT(validator_.EndFunctionBody(GetLocation()));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::Return);
  PopLabel();
  func_ = nullptr;
  return Result::Ok;
}